

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalaha.h
# Opt level: O0

void __thiscall KalahaState<(short)6>::check_invariant(KalahaState<(short)6> *this)

{
  long in_RDI;
  short seed_1;
  short *__end0_1;
  short *__begin0_1;
  short (*__range2_1) [6];
  short player2_sum;
  short seed;
  short *__end0;
  short *__begin0;
  short (*__range2) [6];
  short player1_sum;
  int in_stack_00000204;
  char *in_stack_00000208;
  char *in_stack_00000210;
  short *local_40;
  short local_2c;
  short *local_20;
  short local_a;
  
  local_a = *(short *)(in_RDI + 0x20);
  for (local_20 = (short *)(in_RDI + 8); local_20 != (short *)(in_RDI + 0x14);
      local_20 = local_20 + 1) {
    local_a = local_a + *local_20;
    if (*local_20 < 0) {
      MCTS::assertion_failed(in_stack_00000210,in_stack_00000208,in_stack_00000204);
    }
  }
  local_2c = *(short *)(in_RDI + 0x22);
  for (local_40 = (short *)(in_RDI + 0x14); local_40 != (short *)(in_RDI + 0x20);
      local_40 = local_40 + 1) {
    local_2c = local_2c + *local_40;
    if (*local_40 < 0) {
      MCTS::assertion_failed(in_stack_00000210,in_stack_00000208,in_stack_00000204);
    }
  }
  if ((int)local_a + (int)local_2c != *(short *)(in_RDI + 0x24) * 0xc) {
    MCTS::assertion_failed(in_stack_00000210,in_stack_00000208,in_stack_00000204);
  }
  return;
}

Assistant:

void check_invariant() const
	{
		short player1_sum = player1_store;
		for (auto seed: player1_bins) {
			player1_sum += seed;
			attest(seed >= 0);
		}

		short player2_sum = player2_store;
		for (auto seed: player2_bins) {
			player2_sum += seed;
			attest(seed >= 0);
		}
		attest(player1_sum + player2_sum == (num_bins * 2) * start_seeds);
	}